

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

ConstTokenOrSyntax * __thiscall
slang::syntax::CovergroupDeclarationSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,CovergroupDeclarationSyntax *this,size_t index
          )

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  __index_type _Var2;
  FunctionPortListSyntax *pFVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  switch(index) {
  case 0:
    pSVar1 = &(this->super_MemberSyntax).attributes;
    goto LAB_0020eea3;
  case 1:
    uVar4._0_2_ = (this->covergroup).kind;
    uVar4._2_1_ = (this->covergroup).field_0x2;
    uVar4._3_1_ = (this->covergroup).numFlags;
    uVar5 = (this->covergroup).rawLen;
    uVar6 = *(undefined4 *)&(this->covergroup).info;
    uVar7 = *(undefined4 *)((long)&(this->covergroup).info + 4);
    break;
  case 2:
    uVar4._0_2_ = (this->extends).kind;
    uVar4._2_1_ = (this->extends).field_0x2;
    uVar4._3_1_ = (this->extends).numFlags;
    uVar5 = (this->extends).rawLen;
    uVar6 = *(undefined4 *)&(this->extends).info;
    uVar7 = *(undefined4 *)((long)&(this->extends).info + 4);
    break;
  case 3:
    uVar4._0_2_ = (this->name).kind;
    uVar4._2_1_ = (this->name).field_0x2;
    uVar4._3_1_ = (this->name).numFlags;
    uVar5 = (this->name).rawLen;
    uVar6 = *(undefined4 *)&(this->name).info;
    uVar7 = *(undefined4 *)((long)&(this->name).info + 4);
    break;
  case 4:
    pFVar3 = this->portList;
    goto LAB_0020eeb5;
  case 5:
    pFVar3 = (FunctionPortListSyntax *)this->event;
    goto LAB_0020eeb5;
  case 6:
    uVar4._0_2_ = (this->semi).kind;
    uVar4._2_1_ = (this->semi).field_0x2;
    uVar4._3_1_ = (this->semi).numFlags;
    uVar5 = (this->semi).rawLen;
    uVar6 = *(undefined4 *)&(this->semi).info;
    uVar7 = *(undefined4 *)((long)&(this->semi).info + 4);
    break;
  case 7:
    pSVar1 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             &(this->members).super_SyntaxListBase;
LAB_0020eea3:
    *(SyntaxNode **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(pSVar1->super_SyntaxListBase).super_SyntaxNode;
    goto LAB_0020eeb8;
  case 8:
    uVar4._0_2_ = (this->endgroup).kind;
    uVar4._2_1_ = (this->endgroup).field_0x2;
    uVar4._3_1_ = (this->endgroup).numFlags;
    uVar5 = (this->endgroup).rawLen;
    uVar6 = *(undefined4 *)&(this->endgroup).info;
    uVar7 = *(undefined4 *)((long)&(this->endgroup).info + 4);
    break;
  case 9:
    pFVar3 = (FunctionPortListSyntax *)this->endBlockName;
LAB_0020eeb5:
    *(FunctionPortListSyntax **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         pFVar3;
LAB_0020eeb8:
    _Var2 = '\x01';
    goto LAB_0020eedb;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_0020eed9;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar4;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   4) = uVar5;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   8) = uVar6;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0xc) = uVar7;
LAB_0020eed9:
  _Var2 = '\0';
LAB_0020eedb:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var2;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax CovergroupDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return covergroup;
        case 2: return extends;
        case 3: return name;
        case 4: return portList;
        case 5: return event;
        case 6: return semi;
        case 7: return &members;
        case 8: return endgroup;
        case 9: return endBlockName;
        default: return nullptr;
    }
}